

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall
soul::HEARTGenerator::createSeriesOfWrites
          (HEARTGenerator *this,Expression *target,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> values)

{
  FunctionBuilder *this_00;
  EndpointDeclaration *pEVar1;
  bool bVar2;
  OutputEndpointRef *pOVar3;
  EndpointDetails *pEVar4;
  OutputDeclaration *pOVar5;
  Expression *pEVar6;
  ArrayElementRef *pAVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  int64_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  uint size;
  ulong intValue;
  Context *errorContext;
  SliceRange SVar12;
  pool_ptr<soul::AST::OutputEndpointRef> outputRef;
  pool_ptr<soul::AST::OutputEndpointRef> output;
  Type indexType;
  pool_ptr<soul::heart::Expression> local_1b0;
  CodeLocation local_1a8;
  CodeLocation local_198;
  pool_ptr<soul::heart::Expression> local_188;
  CodeLocation local_180;
  pool_ptr<soul::heart::Expression> local_170;
  CodeLocation local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  Type sampleType_1;
  Type sampleType;
  pool_ptr<soul::AST::Expression> local_e0;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values.e;
  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values.s;
  args_1 = pbVar10;
  cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&output,target);
  if (output.object != (OutputEndpointRef *)0x0) {
    while( true ) {
      if (pbVar11 == pbVar10) {
        return;
      }
      pEVar8 = (Expression *)(pbVar11->_M_dataplus)._M_p;
      pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&output);
      pEVar4 = pool_ptr<soul::AST::EndpointDetails>::operator*(&((pOVar3->output).object)->details);
      bVar2 = AST::EndpointDetails::supportsDataType(pEVar4,pEVar8);
      if (!bVar2) break;
      AST::EndpointDetails::getDataType(&sampleType,pEVar4,pEVar8);
      pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&output);
      local_158._8_8_ =
           (pOVar3->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.
           object;
      if ((SourceCodeText *)local_158._8_8_ != (SourceCodeText *)0x0) {
        (((SourceCodeText *)local_158._8_8_)->super_RefCountedObject).refCount =
             (((SourceCodeText *)local_158._8_8_)->super_RefCountedObject).refCount + 1;
      }
      local_148 = (undefined1  [8])
                  (pOVar3->super_Expression).super_Statement.super_ASTObject.context.location.
                  location.data;
      pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&output);
      pOVar5 = pool_ptr<soul::heart::OutputDeclaration>::operator*
                         (&((pOVar3->output).object)->generatedOutput);
      local_158._0_8_ = (pointer)0x0;
      pEVar6 = evaluateAsExpression(this,pEVar8,&sampleType);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
      BlockBuilder::
      createStatement<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                (&(this->builder).super_BlockBuilder,(CodeLocation *)(local_158 + 8),pOVar5,
                 (pool_ptr<soul::heart::Expression> *)args_1,pEVar6);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)(local_158 + 8));
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&sampleType.structure);
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &pbVar11->_M_string_length;
    }
    (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[4])(&indexType,pEVar8);
    Type::getDescription_abi_cxx11_((string *)&sampleType,&indexType);
    AST::EndpointDetails::getTypesDescription_abi_cxx11_((string *)&sampleType_1,pEVar4);
    Errors::cannotWriteTypeToEndpoint<std::__cxx11::string,std::__cxx11::string>
              (&local_a0,(Errors *)&sampleType,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleType_1,
               args_1);
    AST::Context::throwError(&(target->super_Statement).super_ASTObject.context,&local_a0,false);
  }
  cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&output,target);
  if (output.object != (OutputEndpointRef *)0x0) {
    pAVar7 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                       ((pool_ptr<soul::AST::ArrayElementRef> *)&output);
    local_e0.object = (pAVar7->object).object;
    cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&outputRef,&local_e0);
    if (outputRef.object != (OutputEndpointRef *)0x0) {
      pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&outputRef);
      pEVar4 = pool_ptr<soul::AST::EndpointDetails>::operator*(&((pOVar3->output).object)->details);
      if ((pEVar4->arraySize).object != (Expression *)0x0) {
        this_00 = &this->builder;
        for (; pbVar11 != pbVar10;
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pbVar11->_M_string_length) {
          pEVar8 = (Expression *)(pbVar11->_M_dataplus)._M_p;
          AST::EndpointDetails::getElementDataType(&sampleType_1,pEVar4,pEVar8);
          pEVar6 = evaluateAsExpression(this,pEVar8,&sampleType_1);
          pAVar7 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                             ((pool_ptr<soul::AST::ArrayElementRef> *)&output);
          if (pAVar7->isSlice == true) {
            pAVar7 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                               ((pool_ptr<soul::AST::ArrayElementRef> *)&output);
            SVar12 = AST::ArrayElementRef::getResolvedSliceRange(pAVar7);
            for (intValue = SVar12.start; intValue < SVar12.end; intValue = intValue + 1) {
              pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&outputRef);
              pEVar1 = (pOVar3->output).object;
              local_168.sourceCode.object =
                   (pEVar1->super_ASTObject).context.location.sourceCode.object;
              if (local_168.sourceCode.object != (SourceCodeText *)0x0) {
                ((local_168.sourceCode.object)->super_RefCountedObject).refCount =
                     ((local_168.sourceCode.object)->super_RefCountedObject).refCount + 1;
              }
              local_168.location.data = (pEVar1->super_ASTObject).context.location.location.data;
              pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&outputRef);
              pOVar5 = pool_ptr<soul::heart::OutputDeclaration>::operator*
                                 (&((pOVar3->output).object)->generatedOutput);
              local_170.object =
                   &BlockBuilder::createConstantInt32<unsigned_long>
                              (&this_00->super_BlockBuilder,intValue)->super_Expression;
              BlockBuilder::
              createStatement<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                        (&this_00->super_BlockBuilder,&local_168,pOVar5,&local_170,pEVar6);
              RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_168.sourceCode);
            }
          }
          else {
            pAVar7 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                               ((pool_ptr<soul::AST::ArrayElementRef> *)&output);
            pEVar8 = pool_ptr<soul::AST::Expression>::operator*(&pAVar7->startIndex);
            pEVar9 = evaluateAsExpression(this,pEVar8);
            pAVar7 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                               ((pool_ptr<soul::AST::ArrayElementRef> *)&output);
            pEVar8 = pool_ptr<soul::AST::Expression>::operator->(&pAVar7->startIndex);
            (*(pEVar9->super_Object)._vptr_Object[7])(&sampleType,pEVar9);
            pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&outputRef);
            pOVar5 = pool_ptr<soul::heart::OutputDeclaration>::operator->
                               (&((pOVar3->output).object)->generatedOutput);
            size = 1;
            if ((pOVar5->super_IODeclaration).arraySize.
                super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged != false) {
              size = (pOVar5->super_IODeclaration).arraySize.
                     super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload._M_value;
            }
            errorContext = &(pEVar8->super_Statement).super_ASTObject.context;
            if (sampleType.category == invalid) {
              Type::createWrappedInt(&indexType,size);
              local_198.sourceCode.object = (errorContext->location).sourceCode.object;
              if (local_198.sourceCode.object != (SourceCodeText *)0x0) {
                ((local_198.sourceCode.object)->super_RefCountedObject).refCount =
                     ((local_198.sourceCode.object)->super_RefCountedObject).refCount + 1;
              }
              local_198.location.data =
                   (pEVar8->super_Statement).super_ASTObject.context.location.location.data;
              pEVar9 = BlockBuilder::createCast
                                 (&this_00->super_BlockBuilder,&local_198,pEVar9,&indexType);
              RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_198.sourceCode);
              pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&outputRef);
              pEVar1 = (pOVar3->output).object;
              local_1a8.sourceCode.object =
                   (pEVar1->super_ASTObject).context.location.sourceCode.object;
              if (local_1a8.sourceCode.object != (SourceCodeText *)0x0) {
                ((local_1a8.sourceCode.object)->super_RefCountedObject).refCount =
                     ((local_1a8.sourceCode.object)->super_RefCountedObject).refCount + 1;
              }
              local_1a8.location.data = (pEVar1->super_ASTObject).context.location.location.data;
              pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&outputRef);
              pOVar5 = pool_ptr<soul::heart::OutputDeclaration>::operator*
                                 (&((pOVar3->output).object)->generatedOutput);
              local_1b0.object = pEVar9;
              BlockBuilder::
              createStatement<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                        (&this_00->super_BlockBuilder,&local_1a8,pOVar5,&local_1b0,pEVar6);
              RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_1a8.sourceCode);
              RefCountedPtr<soul::Structure>::~RefCountedPtr(&indexType.structure);
            }
            else {
              index = TypeRules::checkAndGetArrayIndex<soul::AST::Context&>
                                (errorContext,(Value *)&sampleType);
              TypeRules::checkConstantArrayIndex<soul::AST::Context&>
                        (errorContext,index,(ulong)size);
              pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&outputRef);
              pEVar1 = (pOVar3->output).object;
              local_180.sourceCode.object =
                   (pEVar1->super_ASTObject).context.location.sourceCode.object;
              if (local_180.sourceCode.object != (SourceCodeText *)0x0) {
                ((local_180.sourceCode.object)->super_RefCountedObject).refCount =
                     ((local_180.sourceCode.object)->super_RefCountedObject).refCount + 1;
              }
              local_180.location.data = (pEVar1->super_ASTObject).context.location.location.data;
              pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&outputRef);
              pOVar5 = pool_ptr<soul::heart::OutputDeclaration>::operator*
                                 (&((pOVar3->output).object)->generatedOutput);
              local_188.object =
                   &BlockBuilder::createConstantInt32<long>(&this_00->super_BlockBuilder,index)->
                    super_Expression;
              BlockBuilder::
              createStatement<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                        (&this_00->super_BlockBuilder,&local_180,pOVar5,&local_188,pEVar6);
              RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_180.sourceCode);
            }
            soul::Value::~Value((Value *)&sampleType);
          }
          RefCountedPtr<soul::Structure>::~RefCountedPtr(&sampleType_1.structure);
        }
        return;
      }
      pAVar7 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                         ((pool_ptr<soul::AST::ArrayElementRef> *)&output);
      Errors::cannotUseBracketsOnNonArrayEndpoint<>();
      AST::Context::throwError
                (&(pAVar7->super_Expression).super_Statement.super_ASTObject.context,&local_d8,false
                );
    }
  }
  Errors::targetMustBeOutput<>();
  AST::Context::throwError(&(target->super_Statement).super_ASTObject.context,&local_68,false);
}

Assistant:

void createSeriesOfWrites (AST::Expression& target, ArrayView<pool_ref<AST::Expression>> values)
    {
        // Two choices - the target can be an output declaration, or an element of an output declaration
        if (auto output = cast<AST::OutputEndpointRef> (target))
        {
            for (auto v : values)
            {
                const auto& details = output->output->getDetails();

                if (! details.supportsDataType (v))
                    target.context.throwError (Errors::cannotWriteTypeToEndpoint (v->getResultType().getDescription(),
                                                                                  details.getTypesDescription()));

                auto sampleType = details.getDataType (v);

                builder.addWriteStream (output->context.location,
                                        *output->output->generatedOutput, nullptr,
                                        evaluateAsExpression (v, sampleType));
            }

            return;
        }

        if (auto arraySubscript = cast<AST::ArrayElementRef> (target))
        {
            if (auto outputRef = cast<AST::OutputEndpointRef> (arraySubscript->object))
            {
                const auto& details = outputRef->output->getDetails();

                if (details.arraySize == nullptr)
                    arraySubscript->context.throwError (Errors::cannotUseBracketsOnNonArrayEndpoint());

                for (auto v : values)
                {
                    // Find the element type that our expression will write to
                    auto sampleType = details.getElementDataType (v);
                    auto& value = evaluateAsExpression (v, sampleType);

                    if (arraySubscript->isSlice)
                    {
                        auto slice = arraySubscript->getResolvedSliceRange();

                        for (auto i = slice.start; i < slice.end; ++i)
                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput,
                                                    builder.createConstantInt32 (i), value);
                    }
                    else
                    {
                        auto& index = evaluateAsExpression (*arraySubscript->startIndex);
                        auto& context = arraySubscript->startIndex->context;
                        auto constIndex = index.getAsConstant();
                        auto arraySize = outputRef->output->generatedOutput->arraySize.value_or (1);

                        if (constIndex.isValid())
                        {
                            auto fixedIndex = TypeRules::checkAndGetArrayIndex (context, constIndex);
                            TypeRules::checkConstantArrayIndex (context, fixedIndex, (Type::ArraySize) arraySize);

                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput,
                                                    builder.createConstantInt32 (fixedIndex), value);
                        }
                        else
                        {
                            auto indexType = Type::createWrappedInt ((Type::BoundedIntSize) arraySize);
                            auto& wrappedIndex = builder.createCast (context.location, index, indexType);

                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput, wrappedIndex, value);
                        }
                    }
                }

                return;
            }
        }

        target.context.throwError (Errors::targetMustBeOutput());
    }